

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
Fiber<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1497:7)>
::destroy(Fiber<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1497:7)>
          *this)

{
  FiberBase::cancel(&this->super_FiberBase);
  ExceptionOr<kj::Promise<int>_>::~ExceptionOr(&this->result);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&this->func);
  FiberBase::~FiberBase(&this->super_FiberBase);
  return;
}

Assistant:

~Fiber() noexcept(false) { cancel(); }